

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O3

Result host_write_joypad_to_file(Host *host,char *filename)

{
  Result RVar1;
  FileData file_data;
  FileData FStack_28;
  
  joypad_init_file_data(host->joypad_buffer,&FStack_28);
  joypad_write(host->joypad_buffer,&FStack_28);
  RVar1 = file_write(filename,&FStack_28);
  file_data_delete(&FStack_28);
  return (Result)(RVar1 != OK);
}

Assistant:

Result host_write_joypad_to_file(struct Host* host, const char* filename) {
  Result result = ERROR;
  FileData file_data;
  joypad_init_file_data(host->joypad_buffer, &file_data);
  joypad_write(host->joypad_buffer, &file_data);
  CHECK(SUCCESS(file_write(filename, &file_data)));
  result = OK;
error:
  file_data_delete(&file_data);
  return result;
}